

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

TestResult ** srunner_failures(SRunner *sr)

{
  List *lp;
  int iVar1;
  TestResult **ppTVar2;
  TestResult *pTVar3;
  TestResult *tr;
  List *rlst;
  TestResult **trarray;
  int i;
  SRunner *sr_local;
  
  trarray._4_4_ = 0;
  iVar1 = srunner_ntests_failed(sr);
  ppTVar2 = (TestResult **)emalloc((long)iVar1 << 3);
  lp = sr->resultlst;
  check_list_front(lp);
  while( true ) {
    iVar1 = check_list_at_end(lp);
    if (iVar1 != 0) break;
    pTVar3 = (TestResult *)check_list_val(lp);
    iVar1 = non_pass(pTVar3->rtype);
    if (iVar1 != 0) {
      ppTVar2[trarray._4_4_] = pTVar3;
      trarray._4_4_ = trarray._4_4_ + 1;
    }
    check_list_advance(lp);
  }
  return ppTVar2;
}

Assistant:

TestResult **srunner_failures(SRunner * sr)
{
    int i = 0;
    TestResult **trarray;
    List *rlst;

    trarray = (TestResult **)emalloc(sizeof(trarray[0]) * srunner_ntests_failed(sr));

    rlst = sr->resultlst;
    for(check_list_front(rlst); !check_list_at_end(rlst);
        check_list_advance(rlst))
    {
        TestResult *tr = (TestResult *)check_list_val(rlst);

        if(non_pass(tr->rtype))
            trarray[i++] = tr;

    }
    return trarray;
}